

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O0

int __thiscall
sc_core::sc_process_table::queue<sc_core::sc_thread_process_*>::remove
          (queue<sc_core::sc_thread_process_*> *this,char *__filename)

{
  sc_thread_handle psVar1;
  sc_thread_process *prior_p;
  sc_thread_process *now_p;
  sc_thread_process *local_28;
  sc_thread_process *local_20;
  char *local_8;
  
  local_20 = this->m_head;
  local_28 = (sc_thread_process *)0x0;
  do {
    if (local_20 == (sc_thread_process *)0x0) {
      local_8 = (char *)0x0;
LAB_002c775b:
      return (int)local_8;
    }
    if (local_20 == (sc_thread_process *)__filename) {
      local_8 = __filename;
      if (local_28 == (sc_thread_process *)0x0) {
        psVar1 = sc_thread_process::next_exist(local_20);
        this->m_head = psVar1;
      }
      else {
        psVar1 = sc_thread_process::next_exist(local_20);
        sc_thread_process::set_next_exist(local_28,psVar1);
      }
      goto LAB_002c775b;
    }
    local_28 = local_20;
    local_20 = sc_thread_process::next_exist(local_20);
  } while( true );
}

Assistant:

ProcessHandle
sc_process_table::queue<ProcessHandle>::remove( ProcessHandle handle )
{
    ProcessHandle now_p   = m_head; // Entry now examining.
    ProcessHandle prior_p = NULL;   // Entry prior to one now examining.

    while( now_p )
    {
        if ( now_p == handle )
        {
            if ( prior_p )
                prior_p->set_next_exist( now_p->next_exist() );
            else
                m_head = now_p->next_exist();
            return handle;
        }
        prior_p = now_p;
        now_p   = now_p->next_exist();
    }
    return NULL;
}